

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int IDASetEpsLin(void *ida_mem,sunrealtype eplifac)

{
  double in_XMM0_Qa;
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDAMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  IDAMem local_20;
  int local_4;
  
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffd8,
                             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8,(IDALsMem *)0x11b7fa);
  if (local_4 == 0) {
    if (0.0 <= in_XMM0_Qa) {
      if ((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) {
        in_XMM0_Qa = 0.05;
      }
      *(double *)((long)in_stack_ffffffffffffffd8 + 0x68) = in_XMM0_Qa;
      local_4 = 0;
    }
    else {
      IDAProcessError(local_20,-3,0x154,"IDASetEpsLin",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_ls.c"
                      ,"eplifac < 0.0 illegal.");
      local_4 = -3;
    }
  }
  return local_4;
}

Assistant:

int IDASetEpsLin(void* ida_mem, sunrealtype eplifac)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* Check for legal eplifac */
  if (eplifac < ZERO)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_NEG_EPLIFAC);
    return (IDALS_ILL_INPUT);
  }

  idals_mem->eplifac = (eplifac == ZERO) ? PT05 : eplifac;

  return (IDALS_SUCCESS);
}